

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  Expression *item_00;
  Compilation *dst;
  reference ppRVar2;
  size_t sVar3;
  CaseProd *pCVar4;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *in_RSI;
  long in_RDI;
  iterator iVar5;
  size_t i;
  StandardRsCaseItemSyntax *sci_1;
  RsCaseItemSyntax *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range2_1;
  Expression *expr;
  iterator prodIt;
  iterator boundIt;
  Compilation *comp;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  ExpressionSyntax *es;
  iterator __end4;
  iterator __begin4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *__range4;
  ProdItem pi;
  StandardRsCaseItemSyntax *sci;
  RsCaseItemSyntax *item;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsCaseItemSyntax> *__range2;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defItem;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  ProdItem *in_stack_fffffffffffffa28;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> *in_stack_fffffffffffffa30;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *in_stack_fffffffffffffa38;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffa40;
  SmallVectorBase<const_slang::ast::Expression_*> *this;
  Compilation *args_2;
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *args_1;
  Expression *args;
  RsProdItemSyntax *in_stack_fffffffffffffab0;
  ulong local_4b0;
  ASTContext *in_stack_fffffffffffffb68;
  __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
  in_stack_fffffffffffffb70;
  SmallVectorBase<const_slang::ast::Expression_*> local_460 [3];
  undefined1 in_stack_fffffffffffffc02;
  undefined1 in_stack_fffffffffffffc03;
  undefined1 in_stack_fffffffffffffc04;
  undefined1 in_stack_fffffffffffffc05;
  TokenKind in_stack_fffffffffffffc06;
  ASTContext *in_stack_fffffffffffffc08;
  ExpressionSyntax *in_stack_fffffffffffffc20;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffc28;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffc38;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *local_288;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *psStack_280;
  SmallVectorBase<const_slang::ast::Expression_*> local_278 [3];
  ExpressionSyntax *local_218;
  iterator local_210;
  iterator local_200;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *local_1f0;
  StandardRsCaseItemSyntax *local_1b8;
  SyntaxNode *local_1b0;
  RsCaseItemSyntax **local_1a8;
  __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
  local_1a0;
  long local_198;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> local_168 [6];
  span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0x1003e94);
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL>::SmallVector
            ((SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> *)0x1003ea1);
  std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::optional
            ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x1003eae);
  local_198 = local_8 + 0x50;
  local_1a0._M_current =
       (RsCaseItemSyntax **)
       std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffa28);
  local_1a8 = (RsCaseItemSyntax **)
              std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::end
                        ((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)
                         in_stack_fffffffffffffa38);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffa30,
                       (__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_fffffffffffffa28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_1a0);
    local_1b0 = &(*ppRVar2)->super_SyntaxNode;
    if (local_1b0->kind == DefaultRsCaseItem) {
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)0x10040f9);
      if (!bVar1) {
        slang::syntax::SyntaxNode::as<slang::syntax::DefaultRsCaseItemSyntax>(local_1b0);
        in_stack_fffffffffffffab0 =
             not_null<slang::syntax::RsProdItemSyntax_*>::operator*
                       ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x1004125);
        createProdItem((RsProdItemSyntax *)in_stack_fffffffffffffb70._M_current,
                       in_stack_fffffffffffffb68);
        std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator=
                  ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)
                   in_stack_fffffffffffffa40,(ProdItem *)in_stack_fffffffffffffa38);
      }
    }
    else {
      local_1b8 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>(local_1b0);
      not_null<slang::syntax::RsProdItemSyntax_*>::operator*
                ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x1003f7b);
      createProdItem((RsProdItemSyntax *)in_stack_fffffffffffffb70._M_current,
                     in_stack_fffffffffffffb68);
      local_1f0 = &local_1b8->expressions;
      iVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::begin
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x1003fc5);
      local_200 = iVar5;
      iVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::end
                        ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
                         in_stack_fffffffffffffa30);
      local_210 = iVar5;
      while( true ) {
        bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                          ((self_type *)in_stack_fffffffffffffa30,
                           (iterator_base<slang::syntax::ExpressionSyntax_*> *)
                           in_stack_fffffffffffffa28);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        local_218 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                    ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                                 *)0x1004073);
        SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::push_back
                  ((SmallVectorBase<const_slang::syntax::ExpressionSyntax_*> *)
                   in_stack_fffffffffffffa30,(ExpressionSyntax **)in_stack_fffffffffffffa28);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::push_back
                  (in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
        iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
        ::
        operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>_>
                  ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::iterator_base<slang::syntax::ExpressionSyntax_*>,_false>
                    *)in_stack_fffffffffffffa30);
      }
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_1a0);
  }
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1004186);
  item_00 = (Expression *)
            not_null<slang::syntax::ExpressionSyntax_*>::operator*
                      ((not_null<slang::syntax::ExpressionSyntax_*> *)0x10041a4);
  std::span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL>::
  span<slang::SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>_&>
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  this = local_278;
  args = item_00;
  Expression::bindMembershipExpressions
            (in_stack_fffffffffffffc08,in_stack_fffffffffffffc06,(bool)in_stack_fffffffffffffc05,
             (bool)in_stack_fffffffffffffc04,(bool)in_stack_fffffffffffffc03,
             (bool)in_stack_fffffffffffffc02,in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc38);
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL>::SmallVector
            ((SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> *)0x1004214);
  SmallVector<const_slang::ast::Expression_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1004221);
  dst = ASTContext::getCompilation((ASTContext *)0x100422e);
  args_2 = dst;
  SmallVectorBase<const_slang::ast::Expression_*>::begin(local_278);
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::begin(local_168);
  std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)item_00);
  std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL> *)psStack_280);
  args_1 = local_10;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)local_288,
                       (__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)item_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppRVar2 = __gnu_cxx::
              __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xfffffffffffffb70);
    if (((*ppRVar2)->super_SyntaxNode).kind == StandardRsCaseItem) {
      slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>
                (&(*ppRVar2)->super_SyntaxNode);
      local_4b0 = 0;
      while( true ) {
        sVar3 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)0x10043b9);
        if (sVar3 <= local_4b0) break;
        SmallVectorBase<const_slang::ast::Expression_*>::push_back
                  ((SmallVectorBase<const_slang::ast::Expression_*> *)local_288,
                   (Expression **)item_00);
        local_4b0 = local_4b0 + 1;
      }
      SmallVectorBase<const_slang::ast::Expression_*>::copy(local_460,(EVP_PKEY_CTX *)dst,src_00);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
      span<const_slang::ast::Expression_*,_18446744073709551615UL>
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)this,
                 psStack_280);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::push_back
                (local_288,(CaseItem *)item_00);
      SmallVectorBase<const_slang::ast::Expression_*>::clear
                ((SmallVectorBase<const_slang::ast::Expression_*> *)local_288);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::RsCaseItemSyntax_**,_std::span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xfffffffffffffb70);
  }
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
            ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)(local_460 + 2),
             (EVP_PKEY_CTX *)dst,src);
  pCVar4 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,std::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                     ((BumpAllocator *)in_stack_fffffffffffffab0,args,args_1,
                      (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)args_2);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1004548);
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL>::~SmallVector
            ((SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> *)0x1004555);
  SmallVector<const_slang::ast::Expression_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::Expression_*,_5UL> *)0x1004562);
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL>::~SmallVector
            ((SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> *)0x100456f);
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> *)0x100457c);
  return pCVar4;
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true,
                                          /* allowValueRange */ true, *syntax.expr, expressions,
                                          bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}